

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionEvaluator.cpp
# Opt level: O1

SelectionSet * __thiscall
OpenMD::SelectionEvaluator::lookupValue
          (SelectionSet *__return_storage_ptr__,SelectionEvaluator *this,string *variable)

{
  char *pcVar1;
  int iVar2;
  iterator iVar3;
  type_info *ptVar4;
  vector<OpenMD::Token,_std::allocator<OpenMD::Token>_> *__x;
  vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *__x_00;
  _Base_ptr this_00;
  SelectionSet local_88;
  vector<OpenMD::Token,_std::allocator<OpenMD::Token>_> local_70;
  SelectionSet local_58;
  vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> local_38;
  
  createSelectionSets(&local_88,this);
  iVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
          ::find(&(this->variables)._M_t,variable);
  if ((_Rb_tree_header *)iVar3._M_node == &(this->variables)._M_t._M_impl.super__Rb_tree_header) {
    unrecognizedIdentifier(this,variable);
    goto LAB_00265587;
  }
  this_00 = iVar3._M_node + 2;
  ptVar4 = std::any::type((any *)this_00);
  pcVar1 = *(char **)(ptVar4 + 8);
  if (pcVar1 == "N6OpenMD12SelectionSetE") {
LAB_00265594:
    __x_00 = (vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)
             std::__any_caster<OpenMD::SelectionSet>((any *)this_00);
    if (__x_00 == (vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)0x0) {
      std::__throw_bad_any_cast();
    }
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::vector
              (&__return_storage_ptr__->bitsets_,__x_00);
    goto LAB_002655ac;
  }
  if (*pcVar1 != '*') {
    iVar2 = strcmp(pcVar1,"N6OpenMD12SelectionSetE");
    if (iVar2 == 0) goto LAB_00265594;
  }
  ptVar4 = std::any::type((any *)this_00);
  pcVar1 = *(char **)(ptVar4 + 8);
  if (pcVar1 == "St6vectorIN6OpenMD5TokenESaIS1_EE") {
LAB_002654de:
    __x = (vector<OpenMD::Token,_std::allocator<OpenMD::Token>_> *)
          std::__any_caster<std::vector<OpenMD::Token,std::allocator<OpenMD::Token>>>
                    ((any *)this_00);
    if (__x == (vector<OpenMD::Token,_std::allocator<OpenMD::Token>_> *)0x0) {
      std::__throw_bad_any_cast();
    }
    std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>::vector(&local_70,__x);
    expression(&local_58,this,&local_70,2);
    local_38.super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage =
         local_88.bitsets_.
         super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_38.super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl
    .super__Vector_impl_data._M_finish =
         local_88.bitsets_.
         super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_38.super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl
    .super__Vector_impl_data._M_start =
         local_88.bitsets_.
         super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_88.bitsets_.
    super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_58.bitsets_.
         super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_88.bitsets_.
    super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_58.bitsets_.
         super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_88.bitsets_.
    super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_58.bitsets_.
         super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_58.bitsets_.
    super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.bitsets_.
    super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58.bitsets_.
    super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector(&local_38);
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
              (&local_58.bitsets_);
    std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>::~vector(&local_70);
    std::any::operator=((any *)this_00,&local_88);
  }
  else if (*pcVar1 != '*') {
    iVar2 = strcmp(pcVar1,"St6vectorIN6OpenMD5TokenESaIS1_EE");
    if (iVar2 == 0) goto LAB_002654de;
  }
LAB_00265587:
  SelectionSet::parallelReduce(__return_storage_ptr__,&local_88);
LAB_002655ac:
  std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
            (&local_88.bitsets_);
  return __return_storage_ptr__;
}

Assistant:

SelectionSet SelectionEvaluator::lookupValue(const std::string& variable) {
    SelectionSet bs                             = createSelectionSets();
    std::map<std::string, std::any>::iterator i = variables.find(variable);

    if (i != variables.end()) {
      if (i->second.type() == typeid(SelectionSet)) {
        return std::any_cast<SelectionSet>(i->second);
      } else if (i->second.type() == typeid(std::vector<Token>)) {
        bs        = expression(std::any_cast<std::vector<Token>>(i->second), 2);
        i->second = bs; /**@todo fixme */
        return bs.parallelReduce();
      }
    } else {
      unrecognizedIdentifier(variable);
    }

    return bs.parallelReduce();
  }